

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

int r8_nint(double x)

{
  int iVar1;
  
  iVar1 = -(int)(ABS(x) + 0.5);
  if (0.0 <= x) {
    iVar1 = (int)(ABS(x) + 0.5);
  }
  return iVar1;
}

Assistant:

int r8_nint ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_NINT returns the nearest integer to an R8.
//
//  Example:
//
//        X         Value
//
//      1.3         1
//      1.4         1
//      1.5         1 or 2
//      1.6         2
//      0.0         0
//     -0.7        -1
//     -1.1        -1
//     -1.6        -2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the value.
//
//    Output, int R8_NINT, the nearest integer to X.
//
{
  int value;

  if ( x < 0.0 )
  {
    value = - int( fabs ( x ) + 0.5 );
  }
  else
  {
    value =   int( fabs ( x ) + 0.5 );
  }

  return value;
}